

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl.h
# Opt level: O0

CFL_ALLOWED_TYPE is_cfl_allowed(MACROBLOCKD *xd)

{
  BLOCK_SIZE BVar1;
  long in_RDI;
  int plane_bsize;
  int ssy;
  int ssx;
  BLOCK_SIZE bsize;
  MB_MODE_INFO *mbmi;
  bool local_29;
  bool local_1;
  
  BVar1 = *(BLOCK_SIZE *)**(undefined8 **)(in_RDI + 0x1eb8);
  if (*(int *)(in_RDI + 0x29c4 +
              (ulong)((byte)*(undefined2 *)((BLOCK_SIZE *)**(undefined8 **)(in_RDI + 0x1eb8) + 0xa7)
                     & 7) * 4) == 0) {
    local_29 = false;
    if (block_size_wide[BVar1] < 0x21) {
      local_29 = block_size_high[BVar1] < 0x21;
    }
    local_1 = local_29;
  }
  else {
    BVar1 = get_plane_block_size(BVar1,*(int *)(in_RDI + 0xa44),*(int *)(in_RDI + 0xa48));
    local_1 = BVar1 == BLOCK_4X4;
  }
  return local_1;
}

Assistant:

static inline CFL_ALLOWED_TYPE is_cfl_allowed(const MACROBLOCKD *xd) {
  const MB_MODE_INFO *mbmi = xd->mi[0];
  const BLOCK_SIZE bsize = mbmi->bsize;
  assert(bsize < BLOCK_SIZES_ALL);
  if (xd->lossless[mbmi->segment_id]) {
    // In lossless, CfL is available when the partition size is equal to the
    // transform size.
    const int ssx = xd->plane[AOM_PLANE_U].subsampling_x;
    const int ssy = xd->plane[AOM_PLANE_U].subsampling_y;
    const int plane_bsize = get_plane_block_size(bsize, ssx, ssy);
    return (CFL_ALLOWED_TYPE)(plane_bsize == BLOCK_4X4);
  }
  // Spec: CfL is available to luma partitions lesser than or equal to 32x32
  return (CFL_ALLOWED_TYPE)(block_size_wide[bsize] <= 32 &&
                            block_size_high[bsize] <= 32);
}